

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

QVariant * __thiscall QTreeModel::data(QTreeModel *this,QModelIndex *index,int role)

{
  bool bVar1;
  uint uVar2;
  QTreeWidgetItem *pQVar3;
  uint in_ECX;
  QModelIndex *in_RDX;
  QModelIndex *in_RDI;
  QTreeWidgetItem *itm;
  QTreeModel *in_stack_ffffffffffffffb8;
  QModelIndex *pQVar4;
  
  pQVar4 = in_RDI;
  bVar1 = QModelIndex::isValid(in_RDI);
  if (bVar1) {
    pQVar3 = item(in_stack_ffffffffffffffb8,(QModelIndex *)0x90eefb);
    if (pQVar3 == (QTreeWidgetItem *)0x0) {
      ::QVariant::QVariant((QVariant *)0x90ef3c);
    }
    else {
      uVar2 = QModelIndex::column(in_RDX);
      (*pQVar3->_vptr_QTreeWidgetItem[3])(pQVar4,pQVar3,(ulong)uVar2,(ulong)in_ECX);
    }
  }
  else {
    ::QVariant::QVariant((QVariant *)0x90eeea);
  }
  return (QVariant *)in_RDI;
}

Assistant:

QVariant QTreeModel::data(const QModelIndex &index, int role) const
{
    if (!index.isValid())
        return QVariant();
    QTreeWidgetItem *itm = item(index);
    if (itm)
        return itm->data(index.column(), role);
    return QVariant();
}